

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType targetType;
  iterator iVar3;
  cmake *this_00;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  OutputInfo *pOVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_bool>
  pVar8;
  string config_upper;
  string msg;
  size_type __dnew;
  undefined1 local_150 [32];
  key_type local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
  local_110;
  OutputInfo local_90;
  
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    return (OutputInfo *)0x0;
  }
  bVar2 = HaveWellDefinedOutputFiles(this);
  if (!bVar2) {
    paVar1 = &local_110.first.field_2;
    local_90.OutDir._M_dataplus._M_p = (pointer)0x2c;
    local_110.first._M_dataplus._M_p = (pointer)paVar1;
    local_110.first._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_90);
    local_110.first.field_2._M_allocated_capacity = (size_type)local_90.OutDir._M_dataplus._M_p;
    builtin_strncpy(local_110.first._M_dataplus._M_p,"cmGeneratorTarget::GetOutputInfo called for ",
                    0x2c);
    local_110.first._M_string_length = (size_type)local_90.OutDir._M_dataplus._M_p;
    local_110.first._M_dataplus._M_p[(long)local_90.OutDir._M_dataplus._M_p] = '\0';
    psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)(psVar4->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_110);
    targetType = cmTarget::GetType(this->Target);
    cmState::GetTargetTypeName(targetType);
    std::__cxx11::string::append((char *)&local_110);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_110.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p == paVar1) {
      return (OutputInfo *)0x0;
    }
    operator_delete(local_110.first._M_dataplus._M_p,
                    local_110.first.field_2._M_allocated_capacity + 1);
    return (OutputInfo *)0x0;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_110.first,config);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
          ::find(&(this->OutputInfoMap)._M_t,&local_130);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header)
  {
    local_90.OutDir._M_dataplus._M_p = (pointer)&local_90.OutDir.field_2;
    local_90.OutDir._M_string_length = 0;
    local_90.OutDir.field_2._M_local_buf[0] = '\0';
    local_90.ImpDir._M_dataplus._M_p = (pointer)&local_90.ImpDir.field_2;
    local_90.ImpDir._M_string_length = 0;
    local_90.ImpDir.field_2._M_local_buf[0] = '\0';
    local_90.PdbDir._M_dataplus._M_p = (pointer)&local_90.PdbDir.field_2;
    local_90.PdbDir._M_string_length = 0;
    local_90.PdbDir.field_2._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              (&local_110,&local_130,&local_90);
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                        *)&this->OutputInfoMap,&local_110);
    iVar3._M_node = (_Base_ptr)pVar8.first._M_node;
    ComputeOutputDir(this,config,RuntimeBinaryArtifact,&local_90.OutDir);
    ComputeOutputDir(this,config,ImportLibraryArtifact,&local_90.ImpDir);
    local_150._16_4_ = 0x424450;
    local_150._8_8_ = (cmMakefile *)0x3;
    local_150._0_8_ = local_150 + 0x10;
    bVar2 = ComputePDBOutputDir(this,(string *)local_150,config,&local_90.PdbDir);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,CONCAT44(local_150._20_4_,local_150._16_4_) + 1);
    }
    if (!bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_90.PdbDir);
    }
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 2));
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 3));
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.second.PdbDir._M_dataplus._M_p != &local_110.second.PdbDir.field_2) {
      operator_delete(local_110.second.PdbDir._M_dataplus._M_p,
                      local_110.second.PdbDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.second.ImpDir._M_dataplus._M_p != &local_110.second.ImpDir.field_2) {
      operator_delete(local_110.second.ImpDir._M_dataplus._M_p,
                      local_110.second.ImpDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.second.OutDir._M_dataplus._M_p != &local_110.second.OutDir.field_2) {
      operator_delete(local_110.second.OutDir._M_dataplus._M_p,
                      local_110.second.OutDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.PdbDir._M_dataplus._M_p != &local_90.PdbDir.field_2) {
      operator_delete(local_90.PdbDir._M_dataplus._M_p,
                      CONCAT71(local_90.PdbDir.field_2._M_allocated_capacity._1_7_,
                               local_90.PdbDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.ImpDir._M_dataplus._M_p != &local_90.ImpDir.field_2) {
      operator_delete(local_90.ImpDir._M_dataplus._M_p,
                      CONCAT71(local_90.ImpDir.field_2._M_allocated_capacity._1_7_,
                               local_90.ImpDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.OutDir._M_dataplus._M_p != &local_90.OutDir.field_2) {
      operator_delete(local_90.OutDir._M_dataplus._M_p,
                      CONCAT71(local_90.OutDir.field_2._M_allocated_capacity._1_7_,
                               local_90.OutDir.field_2._M_local_buf[0]) + 1);
    }
  }
  else if ((iVar3._M_node[3]._M_parent == (_Base_ptr)0x0 &&
            iVar3._M_node[2]._M_parent == (_Base_ptr)0x0) &&
          (iVar3._M_node[4]._M_parent == (_Base_ptr)0x0)) {
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::operator+(&local_90.OutDir,"Target \'",psVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_110.first.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_110.first.field_2._M_allocated_capacity = *psVar6;
      local_110.first.field_2._8_8_ = plVar5[3];
      local_110.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.first.field_2._M_allocated_capacity = *psVar6;
      local_110.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_110.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    GetBacktrace((cmGeneratorTarget *)local_150);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_110.first,(cmListFileBacktrace *)local_150);
    if ((cmMakefile *)local_150._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.OutDir._M_dataplus._M_p != &local_90.OutDir.field_2) {
      operator_delete(local_90.OutDir._M_dataplus._M_p,
                      CONCAT71(local_90.OutDir.field_2._M_allocated_capacity._1_7_,
                               local_90.OutDir.field_2._M_local_buf[0]) + 1);
    }
    pOVar7 = (OutputInfo *)0x0;
    goto LAB_0034d43e;
  }
  pOVar7 = (OutputInfo *)(iVar3._M_node + 2);
LAB_0034d43e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
    return pOVar7;
  }
  return pOVar7;
}

Assistant:

cmGeneratorTarget::OutputInfo const* cmGeneratorTarget::GetOutputInfo(
  const std::string& config) const
{
  // There is no output information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  // Only libraries and executables have well-defined output files.
  if (!this->HaveWellDefinedOutputFiles()) {
    std::string msg = "cmGeneratorTarget::GetOutputInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmState::GetTargetTypeName(this->GetType());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  OutputInfoMapType::iterator i = this->OutputInfoMap.find(config_upper);
  if (i == this->OutputInfoMap.end()) {
    // Add empty info in map to detect potential recursion.
    OutputInfo info;
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->OutputInfoMap.insert(entry).first;

    // Compute output directories.
    this->ComputeOutputDir(config, cmStateEnums::RuntimeBinaryArtifact,
                           info.OutDir);
    this->ComputeOutputDir(config, cmStateEnums::ImportLibraryArtifact,
                           info.ImpDir);
    if (!this->ComputePDBOutputDir("PDB", config, info.PdbDir)) {
      info.PdbDir = info.OutDir;
    }

    // Now update the previously-prepared map entry.
    i->second = info;
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_DIRECTORY depends on itself.",
      this->GetBacktrace());
    return nullptr;
  }
  return &i->second;
}